

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O1

uint32 scanner_block_hash_fn(ScannerBlock *b,hash_fns_t *fns)

{
  uint32 uVar1;
  void *pvVar2;
  int iVar3;
  
  uVar1 = 0;
  if (0 < (long)fns->data[0]) {
    uVar1 = 0;
    pvVar2 = (void *)0x0;
    do {
      if (b->chars[(long)pvVar2] == (ScanState *)0x0) {
        iVar3 = 1;
      }
      else {
        iVar3 = b->chars[(long)pvVar2]->index + 2;
      }
      uVar1 = uVar1 * 0x11 + iVar3;
      pvVar2 = (void *)((long)pvVar2 + 1);
    } while (fns->data[0] != pvVar2);
  }
  return uVar1;
}

Assistant:

static uint32 scanner_block_hash_fn(ScannerBlock *b, hash_fns_t *fns) {
  uint32 hash = 0;
  intptr_t i, block_size = (intptr_t)fns->data[0];
  ScanState **sb = b->chars;

  for (i = 0; i < block_size; i++) {
    hash *= 17;
    hash += sb[i] ? sb[i]->index + 2 : 1;
  }
  return hash;
}